

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UnicodeString *
icu_63::TimeZoneFormat::formatOffsetWithAsciiDigits
          (int32_t offset,UChar sep,OffsetFields minFields,OffsetFields maxFields,
          UnicodeString *result)

{
  short sVar1;
  int iVar2;
  short sVar3;
  int32_t length;
  undefined6 in_register_00000032;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int fields [3];
  UChar local_4a;
  undefined4 local_48;
  int local_44 [3];
  ulong local_38;
  
  uVar6 = (ulong)maxFields;
  uVar5 = (ulong)(uint)-offset;
  if (0 < offset) {
    uVar5 = (ulong)(uint)offset;
  }
  local_48 = (undefined4)CONCAT62(in_register_00000032,sep);
  local_44[0] = CONCAT22(local_44[0]._2_2_,(short)(offset >> 0x1f) * -2 + 0x2b);
  UnicodeString::unBogus(result);
  sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (result->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  UnicodeString::doReplace(result,0,length,(UChar *)local_44,0,1);
  local_44[0] = (int)(uVar5 / 3600000);
  uVar4 = (int)uVar5 + local_44[0] * -3600000;
  local_44[1] = (int)((ulong)uVar4 * 0x45e7b3 >> 0x26);
  local_44[2] = (int)((ulong)(uVar4 + local_44[1] * -60000) * 0x418938 >> 0x20);
  if ((int)minFields < (int)maxFields) {
    uVar6 = (ulong)(int)maxFields;
    do {
      if (local_44[uVar6] != 0) goto LAB_001f8cf1;
      uVar6 = uVar6 - 1;
    } while ((long)(int)minFields < (long)uVar6);
    uVar6 = (ulong)minFields;
  }
LAB_001f8cf1:
  if (-1 < (int)uVar6) {
    uVar5 = 0;
    local_38 = (ulong)((int)uVar6 + 1);
    do {
      if (uVar5 != 0 && (UChar)local_48 != L'\0') {
        local_4a = (UChar)local_48;
        UnicodeString::doAppend(result,&local_4a,0,1);
      }
      iVar2 = local_44[uVar5];
      sVar1 = (short)((long)iVar2 / 10) + (short)(iVar2 >> 0xf);
      sVar3 = (short)(iVar2 >> 0x1f);
      local_4a = (sVar1 - sVar3) + L'0';
      UnicodeString::doAppend(result,&local_4a,0,1);
      local_4a = (short)iVar2 + (sVar1 - sVar3) * -10 + L'0';
      UnicodeString::doAppend(result,&local_4a,0,1);
      uVar5 = uVar5 + 1;
    } while (local_38 != uVar5);
  }
  return result;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatOffsetWithAsciiDigits(int32_t offset, UChar sep, OffsetFields minFields, OffsetFields maxFields, UnicodeString& result) {
    U_ASSERT(maxFields >= minFields);
    U_ASSERT(offset > -MAX_OFFSET && offset < MAX_OFFSET);

    UChar sign = PLUS;
    if (offset < 0) {
        sign = MINUS;
        offset = -offset;
    }
    result.setTo(sign);

    int fields[3];
    fields[0] = offset / MILLIS_PER_HOUR;
    offset = offset % MILLIS_PER_HOUR;
    fields[1] = offset / MILLIS_PER_MINUTE;
    offset = offset % MILLIS_PER_MINUTE;
    fields[2] = offset / MILLIS_PER_SECOND;

    U_ASSERT(fields[0] >= 0 && fields[0] <= MAX_OFFSET_HOUR);
    U_ASSERT(fields[1] >= 0 && fields[1] <= MAX_OFFSET_MINUTE);
    U_ASSERT(fields[2] >= 0 && fields[2] <= MAX_OFFSET_SECOND);

    int32_t lastIdx = maxFields;
    while (lastIdx > minFields) {
        if (fields[lastIdx] != 0) {
            break;
        }
        lastIdx--;
    }

    for (int32_t idx = 0; idx <= lastIdx; idx++) {
        if (sep && idx != 0) {
            result.append(sep);
        }
        result.append((UChar)(0x0030 + fields[idx]/10));
        result.append((UChar)(0x0030 + fields[idx]%10));
    }

    return result;
}